

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pragma_once(CTcTokenizer *this)

{
  add_include_once(this,this->str_->desc_->fname_);
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pragma_once()
{
    /* add this file to the ONCE list */
    add_include_once(str_->get_desc()->get_fname());

    /* don't retain this pragma in the result */
    clear_linebuf();
}